

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::get_arg
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicStringRef<char> arg_name,
          char **error)

{
  undefined4 uVar1;
  bool bVar2;
  ArgList *ctx;
  Arg *pAVar3;
  ArgMap<char> *in_RCX;
  BasicStringRef<char> *in_RDX;
  FormatterBase *in_RSI;
  Arg *in_RDI;
  char **in_R8;
  Arg *arg;
  
  bVar2 = internal::FormatterBase::check_no_auto_index(in_RSI,in_R8);
  if (bVar2) {
    ctx = internal::FormatterBase::args(in_RSI);
    internal::ArgMap<char>::init((ArgMap<char> *)&in_RSI[1].args_.field_1,(EVP_PKEY_CTX *)ctx);
    pAVar3 = internal::ArgMap<char>::find(in_RCX,in_RDX);
    if (pAVar3 != (Arg *)0x0) {
      (in_RDI->super_Value).field_0.long_long_value = (pAVar3->super_Value).field_0.long_long_value;
      (in_RDI->super_Value).field_0.string.size = (pAVar3->super_Value).field_0.string.size;
      uVar1 = *(undefined4 *)&pAVar3->field_0x14;
      in_RDI->type = pAVar3->type;
      *(undefined4 *)&in_RDI->field_0x14 = uVar1;
      *(undefined8 *)&in_RDI->field_0x18 = *(undefined8 *)&pAVar3->field_0x18;
      return in_RDI;
    }
    *in_R8 = "argument not found";
  }
  memset(in_RDI,0,0x20);
  return in_RDI;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::get_arg(
    BasicStringRef<Char> arg_name, const char *&error) {
  if (check_no_auto_index(error)) {
    map_.init(args());
    const internal::Arg *arg = map_.find(arg_name);
    if (arg)
      return *arg;
    error = "argument not found";
  }
  return internal::Arg();
}